

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_c.h
# Opt level: O0

void __thiscall
dlib::
sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::add(sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      *this,unsigned_long pos,T *item)

{
  ulong uVar1;
  ostream *poVar2;
  string *a;
  ostream *poVar3;
  undefined8 uVar4;
  ulong in_RSI;
  long *in_RDI;
  ostringstream dlib_o_out;
  error_type t;
  unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>
  *in_stack_fffffffffffffdc0;
  unsigned_long in_stack_fffffffffffffdc8;
  sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffdd0;
  ostream local_190;
  ulong local_10;
  
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0x40))();
  if (uVar1 < in_RSI) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar2 = std::operator<<(&local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x58);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../image_transforms/../statistics/../optimization/../sequence/sequence_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>>::add(unsigned long, T &) [seq_base = dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"( pos <= this->size() )");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid sequence::add");
    poVar2 = std::operator<<(poVar2,"\n\tpos must be >= 0 and <= size()");
    poVar2 = std::operator<<(poVar2,"\n\tpos: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"\n\tsize(): ");
    uVar1 = (**(code **)(*in_RDI + 0x40))();
    a = (string *)std::ostream::operator<<(poVar2,uVar1);
    t = (error_type)(uVar1 >> 0x20);
    poVar3 = std::operator<<((ostream *)a,"\n\tthis: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::add(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void sequence_kernel_c<seq_base>::
    add(
        unsigned long pos,
        T& item
    )
    {

        // make sure requires clause is not broken
        DLIB_CASSERT(( pos <= this->size() ), 
                "\tvoid sequence::add"
                << "\n\tpos must be >= 0 and <= size()" 
                << "\n\tpos: " << pos 
                << "\n\tsize(): " << this->size()
                << "\n\tthis: " << this
        );

        // call the real function
        seq_base::add(pos,item);
    }